

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

qulonglong __thiscall QLocale::toULongLong(QLocale *this,QStringView s,bool *ok)

{
  long lVar1;
  QStringView str;
  unsigned_long_long uVar2;
  bool *in_RCX;
  QLocalePrivate *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ::QSharedDataPointer::operator_cast_to_QLocalePrivate_
            ((QSharedDataPointer<QLocalePrivate> *)0x4cc224);
  str.m_data = (storage_type_conflict *)this;
  str.m_size = (qsizetype)ok;
  uVar2 = toIntegral_helper<unsigned_long_long>(in_RDI,str,in_RCX);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

qulonglong QLocale::toULongLong(QStringView s, bool *ok) const
{
    return toIntegral_helper<qulonglong>(d, s, ok);
}